

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<bool,_const_type_safe::boolean_&> * __thiscall
Catch::ExprLhs<bool>::operator==
          (BinaryExpr<bool,_const_type_safe::boolean_&> *__return_storage_ptr__,ExprLhs<bool> *this,
          boolean *rhs)

{
  bool bVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar1 = this->m_lhs;
  bVar2 = rhs->value_;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2 == bVar1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021d5a8;
  (__return_storage_ptr__->super_ITransientExpression).field_0xa = bVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }